

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathLocationSetFilter
               (xmlXPathParserContextPtr ctxt,xmlLocationSetPtr locset,int filterOpIndex,int minPos,
               int maxPos)

{
  int iVar1;
  int iVar2;
  xmlXPathContextPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlDocPtr pxVar5;
  xmlXPathStepOp *pxVar6;
  xmlNodePtr pxVar7;
  int iVar8;
  xmlXPathObjectPtr *ppxVar9;
  int local_7c;
  int locMax;
  xmlXPathObjectPtr *tmp;
  int res;
  xmlNodePtr contextNode;
  int local_58;
  int pos;
  int j;
  int i;
  int oldpp;
  int oldcs;
  xmlXPathStepOpPtr filterOp;
  xmlDocPtr olddoc;
  xmlNodePtr oldnode;
  xmlXPathContextPtr xpctxt;
  int maxPos_local;
  int minPos_local;
  int filterOpIndex_local;
  xmlLocationSetPtr locset_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (((locset != (xmlLocationSetPtr)0x0) && (locset->locNr != 0)) && (filterOpIndex != -1)) {
    pxVar3 = ctxt->context;
    pxVar4 = pxVar3->node;
    pxVar5 = pxVar3->doc;
    iVar1 = pxVar3->contextSize;
    iVar2 = pxVar3->proximityPosition;
    pxVar6 = ctxt->comp->steps;
    pxVar3->contextSize = locset->locNr;
    local_58 = 0;
    contextNode._4_4_ = 1;
    for (pos = 0; pos < locset->locNr; pos = pos + 1) {
      pxVar7 = (xmlNodePtr)locset->locTab[pos]->user;
      pxVar3->node = pxVar7;
      pxVar3->proximityPosition = pos + 1;
      if ((pxVar7->type != XML_NAMESPACE_DECL) && (pxVar7->doc != (_xmlDoc *)0x0)) {
        pxVar3->doc = pxVar7->doc;
      }
      iVar8 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar6 + filterOpIndex,1);
      if (ctxt->error != 0) break;
      if (iVar8 < 0) {
        xmlXPathErr(ctxt,7);
        break;
      }
      if (((iVar8 == 0) || (contextNode._4_4_ < minPos)) || (maxPos < contextNode._4_4_)) {
        xmlXPathFreeObject(locset->locTab[pos]);
        locset->locTab[pos] = (xmlXPathObjectPtr)0x0;
      }
      else {
        if (pos != local_58) {
          locset->locTab[local_58] = locset->locTab[pos];
          locset->locTab[pos] = (xmlXPathObjectPtr)0x0;
        }
        local_58 = local_58 + 1;
      }
      if (iVar8 != 0) {
        if (contextNode._4_4_ == maxPos) {
          pos = pos + 1;
          break;
        }
        contextNode._4_4_ = contextNode._4_4_ + 1;
      }
    }
    for (; pos < locset->locNr; pos = pos + 1) {
      xmlXPathFreeObject(locset->locTab[pos]);
    }
    locset->locNr = local_58;
    if ((10 < locset->locMax) && (locset->locNr < locset->locMax / 2)) {
      local_7c = locset->locNr;
      if (local_7c < 10) {
        local_7c = 10;
      }
      ppxVar9 = (xmlXPathObjectPtr *)(*xmlRealloc)(locset->locTab,(long)local_7c << 3);
      if (ppxVar9 == (xmlXPathObjectPtr *)0x0) {
        xmlXPathPErrMemory(ctxt,"shrinking locset\n");
      }
      else {
        locset->locTab = ppxVar9;
        locset->locMax = local_7c;
      }
    }
    pxVar3->node = pxVar4;
    pxVar3->doc = pxVar5;
    pxVar3->contextSize = iVar1;
    pxVar3->proximityPosition = iVar2;
  }
  return;
}

Assistant:

static void
xmlXPathLocationSetFilter(xmlXPathParserContextPtr ctxt,
		          xmlLocationSetPtr locset,
		          int filterOpIndex,
                          int minPos, int maxPos)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((locset == NULL) || (locset->locNr == 0) || (filterOpIndex == -1))
        return;

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = locset->locNr;

    for (i = 0, j = 0, pos = 1; i < locset->locNr; i++) {
        xmlNodePtr contextNode = locset->locTab[i]->user;
        int res;

        xpctxt->node = contextNode;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((contextNode->type != XML_NAMESPACE_DECL) &&
            (contextNode->doc != NULL))
            xpctxt->doc = contextNode->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                locset->locTab[j] = locset->locTab[i];
                locset->locTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial location set. */
            xmlXPathFreeObject(locset->locTab[i]);
            locset->locTab[i] = NULL;
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    for (; i < locset->locNr; i++)
        xmlXPathFreeObject(locset->locTab[i]);

    locset->locNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((locset->locMax > XML_NODESET_DEFAULT) &&
        (locset->locNr < locset->locMax / 2)) {
        xmlXPathObjectPtr *tmp;
        int locMax = locset->locNr;

        if (locMax < XML_NODESET_DEFAULT)
            locMax = XML_NODESET_DEFAULT;
        tmp = (xmlXPathObjectPtr *) xmlRealloc(locset->locTab,
                locMax * sizeof(xmlXPathObjectPtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking locset\n");
        } else {
            locset->locTab = tmp;
            locset->locMax = locMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}